

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall ON_Material::Internal_WriteV5(ON_Material *this,ON_BinaryArchive *file)

{
  int i;
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ON_RdkMaterialInstanceIdObsoleteUserData *this_00;
  ON_UUID *uuid;
  ON_UserData *pOVar7;
  long lVar8;
  ON_wString obsolete_flamingo_library;
  ON_UserData *local_38;
  
  iVar6 = ON_BinaryArchive::Archive3dmVersion(file);
  if (iVar6 < 4) {
    bVar4 = Internal_WriteV3(this,file);
    if (!bVar4) {
      return false;
    }
    goto LAB_004d20f2;
  }
  bVar4 = ON_BinaryArchive::Write3dmChunkVersion(file,2,0);
  iVar6 = ON_BinaryArchive::Archive3dmVersion(file);
  if (!bVar4) {
    return false;
  }
  bVar4 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,(uint)(0x3b < iVar6) * 3 + 3);
  if (!bVar4) {
    return false;
  }
  uuid = ON_ModelComponent::Id(&this->super_ON_ModelComponent);
  bVar4 = ON_BinaryArchive::WriteUuid(file,uuid);
  if ((!bVar4) ||
     (bVar4 = ON_BinaryArchive::Write3dmReferencedComponentIndex
                        (file,&this->super_ON_ModelComponent), !bVar4)) {
LAB_004d23c1:
    ON_BinaryArchive::EndWrite3dmChunk(file);
    return false;
  }
  ON_ModelComponent::Name((ON_ModelComponent *)&stack0xffffffffffffffc0);
  bVar4 = ON_BinaryArchive::WriteString(file,(ON_wString *)&stack0xffffffffffffffc0);
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc0);
  if (((((!bVar4) ||
        (((bVar4 = ON_BinaryArchive::WriteUuid(file,&this->m_plugin_id), !bVar4 ||
          (bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_ambient), !bVar4)) ||
         (bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_diffuse), !bVar4)))) ||
       (((bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_emission), !bVar4 ||
         (bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_specular), !bVar4)) ||
        (bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_reflection), !bVar4)))) ||
      ((bVar4 = ON_BinaryArchive::WriteColor(file,&this->m_transparent), !bVar4 ||
       (bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_index_of_refraction), !bVar4)))) ||
     ((bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_reflectivity), !bVar4 ||
      ((bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_shine), !bVar4 ||
       (bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_transparency), !bVar4))))))
  goto LAB_004d23c1;
  bVar4 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,0);
  if (bVar4) {
    i = (this->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
    local_38 = (ON_UserData *)(long)i;
    bVar4 = 0 < (long)local_38;
    bVar5 = ON_BinaryArchive::WriteInt(file,i);
    if (bVar5 && bVar4) {
      pOVar7 = (ON_UserData *)0x1;
      lVar8 = 0;
      do {
        bVar5 = ON_BinaryArchive::WriteObject
                          (file,(ON_Object *)
                                ((long)&((ON_Texture *)
                                        (&((ON_Texture *)
                                          (&((ON_Texture *)
                                            (&((this->m_textures).super_ON_ClassArray<ON_Texture>.
                                              m_a)->m_texture_id + -1))->m_texture_id + -1))->
                                          m_texture_id + -1))->m_texture_id +
                                lVar8 + 0xfffffffffffffff0U));
        if (local_38 <= pOVar7) break;
        lVar8 = lVar8 + 0x200;
        pOVar7 = (ON_UserData *)((long)&(pOVar7->super_ON_Object)._vptr_ON_Object + 1);
      } while (bVar5);
    }
    bVar4 = ON_BinaryArchive::EndWrite3dmChunk(file);
    ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffc0,&ON_wString::EmptyString);
    if (((bVar4 & bVar5) == 1) &&
       (bVar4 = ON_BinaryArchive::WriteString(file,(ON_wString *)&stack0xffffffffffffffc0), bVar4))
    {
      ON_BinaryArchive::WriteArray(file,&this->m_material_channel);
    }
  }
  else {
    ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffffc0,&ON_wString::EmptyString);
  }
  bVar4 = ON_BinaryArchive::WriteBool(file,this->m_bShareable);
  if (bVar4) {
    bVar4 = ON_BinaryArchive::WriteBool(file,this->m_bDisableLighting);
    if (bVar4 && 0x3b < iVar6) {
      bVar4 = ON_BinaryArchive::WriteBool(file,this->m_bFresnelReflections);
      if ((((!bVar4) ||
           (bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_reflection_glossiness), !bVar4)) ||
          (bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_refraction_glossiness), !bVar4)) ||
         ((bVar4 = ON_BinaryArchive::WriteDouble(file,this->m_fresnel_index_of_refraction), !bVar4
          || (bVar4 = ON_BinaryArchive::WriteUuid(file,&this->m_rdk_material_instance_id), !bVar4)))
         ) goto LAB_004d249e;
      bVar4 = ON_BinaryArchive::WriteBool
                        (file,this->m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);
    }
  }
  else {
LAB_004d249e:
    bVar4 = false;
  }
  ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffc0);
  bVar5 = ON_BinaryArchive::EndWrite3dmChunk(file);
  if ((bVar5 & bVar4) != 1) {
    return false;
  }
LAB_004d20f2:
  iVar6 = ON_BinaryArchive::Archive3dmVersion(file);
  if (0x3b < iVar6) {
    return true;
  }
  bVar4 = ::operator==(&ON_nil_uuid,&this->m_rdk_material_instance_id);
  if (!bVar4) {
    this_00 = (ON_RdkMaterialInstanceIdObsoleteUserData *)operator_new(0xe8);
    ON_RdkMaterialInstanceIdObsoleteUserData::ON_RdkMaterialInstanceIdObsoleteUserData(this_00);
    uVar2 = (this->m_rdk_material_instance_id).Data2;
    uVar3 = (this->m_rdk_material_instance_id).Data3;
    uVar1 = *(undefined8 *)(this->m_rdk_material_instance_id).Data4;
    (this_00->m_rdk_material_instance_id).Data1 = (this->m_rdk_material_instance_id).Data1;
    (this_00->m_rdk_material_instance_id).Data2 = uVar2;
    (this_00->m_rdk_material_instance_id).Data3 = uVar3;
    *(undefined8 *)(this_00->m_rdk_material_instance_id).Data4 = uVar1;
    ON_Object::AttachUserData((ON_Object *)this,(ON_UserData *)this_00);
    return true;
  }
  return true;
}

Assistant:

bool ON_Material::Internal_WriteV5( ON_BinaryArchive& file ) const
{
  bool rc = false;
  if ( file.Archive3dmVersion() <= 3 )
  {
    // V2 or V3 file format
    rc = Internal_WriteV3(file);
  }
  else
  {
    // V4 file format

    // The chunk version 2.0 prevents old V3 IO code from attempting
    // to read this material
    rc = file.Write3dmChunkVersion(2,0); // never change the 2,0


    // version 1.2 field (20061113*)
    // version 1.3 fields (20100917*)
    // version 1.4 fields 6.0.2013-11-6
    // version 1.5 fields 6.0.2014-05-16 (RDK material instance id)
    // version 1.6 fields 6.0.2014-07-11 (m_bUseDiffuseTextureAlphaForObjectTransparencyTexture)
    const int minor_version = (file.Archive3dmVersion() >= 60) ? 6 : 3;
    if (rc) rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,minor_version);
    if (rc)
    {
      for(;;)
      {
        if ( rc ) rc = file.WriteUuid(Id());
        if ( rc ) rc = file.Write3dmReferencedComponentIndex(*this);
        if ( rc ) rc = file.WriteString(Name());

        if ( rc ) rc = file.WriteUuid(m_plugin_id);

        if ( rc ) rc = file.WriteColor( m_ambient );
        if ( rc ) rc = file.WriteColor( m_diffuse );
        if ( rc ) rc = file.WriteColor( m_emission );
        if ( rc ) rc = file.WriteColor( m_specular );
        if ( rc ) rc = file.WriteColor( m_reflection );
        if ( rc ) rc = file.WriteColor( m_transparent );

        if ( rc ) rc = file.WriteDouble( m_index_of_refraction );
        if ( rc ) rc = file.WriteDouble( m_reflectivity );
        if ( rc ) rc = file.WriteDouble( m_shine );
        if ( rc ) rc = file.WriteDouble( m_transparency );

        if ( !rc )
          break;

        // array of textures written in a way that user data persists
        rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0);
        if (rc)
        {
          int i, count = m_textures.Count();
          rc = file.WriteInt(count);
          for ( i = 0; i < count && rc; i++ )
          {
            rc = file.WriteObject(&m_textures[i]);
          }
          if ( !file.EndWrite3dmChunk() )
            rc = false;
        }

        //version 1.1 field
        ON_wString obsolete_flamingo_library = ON_wString::EmptyString;
        if (rc) rc = file.WriteString(obsolete_flamingo_library);

        // version 1.2 field (20061113)
        if (rc) rc = file.WriteArray(m_material_channel);

        // version 1.3 fields (20100917*)
        rc = file.WriteBool(m_bShareable);
        if (!rc) break;
        rc = file.WriteBool(m_bDisableLighting);
        if (!rc) break;

        if ( minor_version >= 4 )
        {
          rc = file.WriteBool(m_bFresnelReflections);
          if (!rc) break;
          rc = file.WriteDouble(m_reflection_glossiness);
          if (!rc) break;
          rc = file.WriteDouble(m_refraction_glossiness);
          if (!rc) break;
          rc = file.WriteDouble(m_fresnel_index_of_refraction);
          if (!rc) break;
          if (minor_version >= 5)
          {
            rc = file.WriteUuid(m_rdk_material_instance_id);
            if (!rc) break;
          }
          if (minor_version >= 6)
          {
            rc = file.WriteBool(m_bUseDiffuseTextureAlphaForObjectTransparencyTexture);
            if (!rc) break;
          }
        }

        break;
      }
      if (!file.EndWrite3dmChunk() )
        rc = false;
    }
  }

  if (rc && file.Archive3dmVersion() < 60)
  {
    if (RdkMaterialInstanceIdIsNotNil())
    {
      // For V5 files and earlier, we need to save
      // the RDK material instance id as user data.
      // Because ON_RdkMaterialInstanceIdObsoleteUserData.DeleteAfterWrite()
      // returns true, the user data we are attaching here will be deleted
      // after it is written.
      ON_RdkMaterialInstanceIdObsoleteUserData* ud = new ON_RdkMaterialInstanceIdObsoleteUserData();
      ud->m_rdk_material_instance_id = RdkMaterialInstanceId();
      const_cast<ON_Material*>(this)->AttachUserData(ud);
    }
  }

  return rc;
}